

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O3

void __thiscall xemmai::t_object::f_cyclic_decrement(t_object *this)

{
  t_type *ptVar1;
  size_t sVar2;
  char *pcVar3;
  
  ptVar1 = this->v_type;
  sVar2 = ptVar1->v_instance_fields;
  if (sVar2 != 0) {
    pcVar3 = this->v_data + (ptVar1->v_fields_offset - 0x48);
    do {
      if ((t_object *)0x4 < *(t_object **)pcVar3) {
        f_cyclic_decrement_push(*(t_object **)pcVar3);
      }
      pcVar3 = pcVar3 + 0x10;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
    ptVar1 = this->v_type;
  }
  if (ptVar1->f_finalize != (_func_void_t_object_ptr_t_scan *)0x0) {
    (*ptVar1->f_finalize)(this,f_push<&xemmai::t_object::f_cyclic_decrement_push>);
    ptVar1 = this->v_type;
  }
  if ((ptVar1->v_this).v_p._M_b._M_p != (__pointer_type)0x0) {
    f_cyclic_decrement_push((ptVar1->v_this).v_p._M_b._M_p);
  }
  this->v_type = (t_type *)0x0;
  return;
}

Assistant:

void f_cyclic_decrement()
	{
		f_scan_fields(f_push<&t_object::f_cyclic_decrement_push>);
		if (v_type->f_finalize) v_type->f_finalize(this, f_push<&t_object::f_cyclic_decrement_push>);
		if (v_type->v_this) v_type->v_this->f_cyclic_decrement_push();
		v_type = nullptr;
	}